

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

int ON_GetSpanIndices(int order,int cv_count,double *knot,int *span_indices)

{
  int local_34;
  int local_30;
  int j;
  int next_span_index;
  int span_index;
  int *span_indices_local;
  double *knot_local;
  int cv_count_local;
  int order_local;
  
  j = -1;
  local_30 = 0;
  local_34 = 0;
  while( true ) {
    if (j == local_30) {
      span_indices[local_34] = j + order + -1;
      return local_34;
    }
    j = local_30;
    span_indices[local_34] = local_30 + order + -2;
    local_30 = ON_NextNurbsSpanIndex(order,cv_count,knot,local_30);
    if (local_30 < 0) break;
    local_34 = local_34 + 1;
  }
  return local_30;
}

Assistant:

int ON_GetSpanIndices(int order, 
                            int cv_count, 
                            const double* knot, 
                            int* span_indices)

/* span_indices should have size greater than the number of 
   spans (cv_count is big enough).

  returns span count.
  fills in span_indices with index of last in each bunch of multiple knots at 
  start of span, and first in buch at end of nurb.


  */
{
  int span_index, next_span_index, j;

  span_index = -1;
  next_span_index = 0;
  j = 0;
  while (span_index != next_span_index) {
    span_index = next_span_index;
    span_indices[j] = span_index + order - 2;
    next_span_index = ON_NextNurbsSpanIndex(order, cv_count, knot, span_index);
    if (next_span_index < 0) 
      return next_span_index;
    j++;
  } 
  
  span_indices[j] = span_index + order - 1;

  return j;
}